

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# code_generator.cpp
# Opt level: O2

void __thiscall Code_generator::visit(Code_generator *this,Inst_branch *s)

{
  Expression *pEVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  ushort uVar5;
  ulong uVar6;
  ushort uVar7;
  string symbol;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  ast::Instruction::check_alignment(&s->super_Instruction);
  uVar2 = s->condition - 0x147;
  uVar5 = 0;
  uVar7 = 0;
  if (uVar2 < 10) {
    uVar7 = (ushort)*(undefined4 *)(&DAT_0012be40 + (ulong)uVar2 * 4);
  }
  iVar3 = (*s->expression->_vptr_Expression[3])();
  if ((char)iVar3 != '\0') {
    pEVar1 = s->expression;
    if (pEVar1->type == LABEL) {
      (*pEVar1->_vptr_Expression[4])(&symbol,pEVar1);
      uVar2 = (s->super_Instruction).super_Statement.section_index;
      std::__cxx11::string::string((string *)&local_70,(string *)&symbol);
      uVar4 = ast::Symbols::get_section(&local_70);
      std::__cxx11::string::~string((string *)&local_70);
      pEVar1 = s->expression;
      if (uVar2 == uVar4) {
        uVar2 = (uint)(ushort)pEVar1->value - (s->super_Instruction).super_Statement.section_offset;
        uVar6 = (ulong)(uVar2 - 2);
        if ((uVar2 & 1) != 0) {
          string_printf_abi_cxx11_
                    (&local_90,"Address of %s = 0x%x, must be even!",symbol._M_dataplus._M_p,uVar6);
          warning_report(&pEVar1->location,&local_90);
          std::__cxx11::string::~string((string *)&local_90);
        }
        if (uVar2 - 0x402 < 0xfffff800) {
          pEVar1 = s->expression;
          string_printf_abi_cxx11_
                    (&local_b0,
                     "Interval between PC and target address: %+d (0x%x) - isn\'t codable in %d bit two\'s complement"
                     ,uVar6,uVar6,0xb);
          error_report(&pEVar1->location,&local_b0);
          std::__cxx11::string::~string((string *)&local_b0);
        }
        uVar5 = (ushort)((int)(uVar2 - 2) >> 1);
      }
      else {
        string_printf_abi_cxx11_
                  (&local_d0,"Label \"%s\" is defined in another section",symbol._M_dataplus._M_p);
        error_report(&pEVar1->location,&local_d0);
        std::__cxx11::string::~string((string *)&local_d0);
        uVar5 = 0;
      }
      std::__cxx11::string::~string((string *)&symbol);
    }
    else {
      uVar5 = 0;
      if (pEVar1->type == ABSOLUTE) {
        uVar2 = pEVar1->value;
        if ((uVar2 & 1) != 0) {
          std::__cxx11::string::string
                    ((string *)&local_50,"Must be an even value!",(allocator *)&symbol);
          warning_report(&pEVar1->location,&local_50);
          std::__cxx11::string::~string((string *)&local_50);
        }
        uVar5 = (ushort)(uVar2 >> 1);
      }
    }
    uVar5 = uVar5 & 0x3ff;
  }
  ast::Sections::write16
            ((s->super_Instruction).super_Statement.section_index,
             (s->super_Instruction).super_Statement.section_offset,uVar5 | uVar7);
  return;
}

Assistant:

void Code_generator::visit(Inst_branch *s)
{
	s->check_alignment();
	auto code = 0U;
	switch (s->condition) {
	case EQ:
		code = BEQ_OPCODE;
		break;
	case NE:
		code = BNE_OPCODE;
		break;
	case CC:
       	case LO:
		code = BCC_OPCODE;
		break;
	case CS:
	case HS:
		code = BCS_OPCODE;
		break;
	case GE:
		code = BGE_OPCODE;
		break;
	case LT:
		code = BLT_OPCODE;
		break;
	case B:
		code = B_OPCODE;
		break;
	case BL:
		code = BL_OPCODE;
		break;
	}
	auto offset = 0;    //  o offset do branch é um valor com sinal
	if (s->expression->evaluate()) {
		auto exp_type = s->expression->get_type();
		if (exp_type == ABSOLUTE) {
			auto expression_value = s->expression->get_value();
			if ((expression_value & 1) != 0)
				warning_report(&s->expression->location, "Must be an even value!");
			offset = expression_value >> 1;
		}
		else if (exp_type == Value_type::LABEL) {
			string symbol = s->expression->get_symbol();
			if (s->section_index == Symbols::get_section(symbol)) { //  Label resolvida se pertencer à mesma secção
				offset = s->expression->get_value() - s->section_offset - 2;    //  O PC está dois endereços à frente
				if ((offset & 1) != 0)
					warning_report(&s->expression->location,
						string_printf("Address of %s = 0x%x, must be even!", symbol.c_str(), offset));
				if (offset >= (1 << BRANCH_OFFSET_SIZE) || offset < (~0 << BRANCH_OFFSET_SIZE))
					error_report(&s->expression->location,
						string_printf("Interval between PC and target address: %+d (0x%x) - "
								"isn't codable in %d bit two's complement",
								offset, offset, BRANCH_OFFSET_SIZE + 1));
				offset >>= 1;
			} else {    // A Label pertence a outra secção. Será resolvida na fase de relocalização
				error_report(&s->expression->location,
					string_printf( "Label \"%s\" is defined in another section", symbol.c_str()));
			}
		}
	}
	Sections::write16(s->section_index, s->section_offset,
		static_cast<uint16_t>(code | ((offset & MAKE_MASK(BRANCH_OFFSET_SIZE, 0)) << BRANCH_OFFSET_POSITION)));
}